

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

uchar * MeCab::Darts::_resize<unsigned_char>(uchar *ptr,size_t n,size_t l,uchar v)

{
  uchar *puVar1;
  uchar in_CL;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  ulong in_RSI;
  void *in_RDI;
  size_t i_1;
  size_t i;
  uchar *tmp;
  ulong local_38;
  ulong local_30;
  
  puVar1 = (uchar *)operator_new__(CONCAT71(in_register_00000011,in_DL));
  for (local_30 = 0; local_38 = in_RSI, local_30 < in_RSI; local_30 = local_30 + 1) {
    puVar1[local_30] = *(uchar *)((long)in_RDI + local_30);
  }
  for (; local_38 < CONCAT71(in_register_00000011,in_DL); local_38 = local_38 + 1) {
    puVar1[local_38] = in_CL;
  }
  if (in_RDI != (void *)0x0) {
    operator_delete__(in_RDI);
  }
  return puVar1;
}

Assistant:

inline T* _resize(T* ptr, size_t n, size_t l, T v) {
  T *tmp = new T[l];
  for (size_t i = 0; i < n; ++i) tmp[i] = ptr[i];
  for (size_t i = n; i < l; ++i) tmp[i] = v;
  delete [] ptr;
  return tmp;
}